

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DatatypeValidator::setTypeName(DatatypeValidator *this,XMLCh *typeName)

{
  XMLCh *pXVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  
  if (this->fTypeName != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    this->fTypeName = (XMLCh *)0x0;
  }
  if (typeName == (XMLCh *)0x0) {
    this->fTypeLocalName = L"";
    this->fTypeUri = L"";
  }
  else {
    XVar4 = XMLString::stringLen(typeName);
    iVar2 = XMLString::indexOf(typeName,L',');
    __n = XVar4 * 2 + 2;
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    this->fTypeName = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memmove((XMLCh *)CONCAT44(extraout_var,iVar3),typeName,__n);
    if (iVar2 == -1) {
      this->fTypeUri = (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      this->fTypeLocalName = this->fTypeName;
    }
    else {
      this->fTypeUri = this->fTypeName;
      pXVar1 = this->fTypeName + iVar2;
      this->fTypeLocalName = pXVar1 + 1;
      *pXVar1 = L'\0';
    }
  }
  return;
}

Assistant:

void DatatypeValidator::setTypeName(const XMLCh* const typeName)
{
    if (fTypeName)
    {
        fMemoryManager->deallocate(fTypeName);
        fTypeName = 0;
    }

    if (typeName)
    {
        XMLSize_t nameLen = XMLString::stringLen(typeName);
        int commaOffset = XMLString::indexOf(typeName, chComma);

        fTypeName = (XMLCh*) fMemoryManager->allocate
        (
            (nameLen + 1) * sizeof(XMLCh)
        );
	    XMLString::moveChars(fTypeName, typeName, nameLen+1);

        if ( commaOffset == -1) {
            fTypeUri = SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
            fTypeLocalName = fTypeName;
        }
        else {
            fTypeUri = fTypeName;
            fTypeLocalName = &fTypeName[commaOffset+1];
            fTypeName[commaOffset] = chNull;
        }
    }
    else
    {
        fTypeUri = fTypeLocalName = XMLUni::fgZeroLenString;
    }
}